

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall
Rml::Element::AddAnimationKey
          (Element *this,String *property_name,Property *target_value,float duration,Tween tween)

{
  PropertyId PVar1;
  bool bVar2;
  PropertyId PVar3;
  reference this_00;
  float fVar4;
  bool result;
  ElementAnimation *existing_animation;
  iterator __end1;
  iterator __begin1;
  ElementAnimationList *__range1;
  ElementAnimation *pEStack_48;
  PropertyId property_id;
  ElementAnimation *animation;
  float duration_local;
  Property *target_value_local;
  String *property_name_local;
  Element *this_local;
  Tween tween_local;
  
  pEStack_48 = (ElementAnimation *)0x0;
  PVar1 = StyleSheetSpecification::GetPropertyId(property_name);
  __end1 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::begin
                     (&this->animations);
  existing_animation =
       (ElementAnimation *)
       ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                 (&this->animations);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                                     *)&existing_animation), this_00 = pEStack_48, bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
              ::operator*(&__end1);
    PVar3 = ElementAnimation::GetPropertyId(this_00);
    if (PVar3 == PVar1) break;
    __gnu_cxx::
    __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
    ::operator++(&__end1);
  }
  pEStack_48 = this_00;
  if (pEStack_48 == (ElementAnimation *)0x0) {
    tween_local.callback._7_1_ = false;
  }
  else {
    fVar4 = ElementAnimation::GetDuration(pEStack_48);
    tween_local.callback._7_1_ =
         ElementAnimation::AddKey(pEStack_48,fVar4 + duration,target_value,this,tween,true);
  }
  return tween_local.callback._7_1_;
}

Assistant:

bool Element::AddAnimationKey(const String& property_name, const Property& target_value, float duration, Tween tween)
{
	ElementAnimation* animation = nullptr;

	PropertyId property_id = StyleSheetSpecification::GetPropertyId(property_name);

	for (auto& existing_animation : animations)
	{
		if (existing_animation.GetPropertyId() == property_id)
		{
			animation = &existing_animation;
			break;
		}
	}
	if (!animation)
		return false;

	bool result = animation->AddKey(animation->GetDuration() + duration, target_value, *this, tween, true);

	return result;
}